

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_lifetime.h
# Opt level: O2

void __thiscall
validation_layer::HandleLifetimeValidation::addHandle
          (HandleLifetimeValidation *this,ze_sampler_handle_t handle)

{
  ze_sampler_handle_t local_20;
  __uniq_ptr_impl<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>
  local_18;
  
  local_18._M_t.
  super__Tuple_impl<0UL,_validation_layer::_zel_handle_state_t_*,_std::default_delete<validation_layer::_zel_handle_state_t>_>
  .super__Head_base<0UL,_validation_layer::_zel_handle_state_t_*,_false>._M_head_impl =
       (tuple<validation_layer::_zel_handle_state_t_*,_std::default_delete<validation_layer::_zel_handle_state_t>_>
        )(_Tuple_impl<0UL,_validation_layer::_zel_handle_state_t_*,_std::default_delete<validation_layer::_zel_handle_state_t>_>
          )0x0;
  local_20 = handle;
  std::
  _Hashtable<_ze_sampler_handle_t*,std::pair<_ze_sampler_handle_t*const,std::unique_ptr<validation_layer::_zel_handle_state_t,std::default_delete<validation_layer::_zel_handle_state_t>>>,std::allocator<std::pair<_ze_sampler_handle_t*const,std::unique_ptr<validation_layer::_zel_handle_state_t,std::default_delete<validation_layer::_zel_handle_state_t>>>>,std::__detail::_Select1st,std::equal_to<_ze_sampler_handle_t*>,std::hash<_ze_sampler_handle_t*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<_ze_sampler_handle_t*const,std::unique_ptr<validation_layer::_zel_handle_state_t,std::default_delete<validation_layer::_zel_handle_state_t>>>>
            (&this->samplerHandleStateMap,&local_20);
  std::
  unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>
  ::~unique_ptr((unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>
                 *)&local_18);
  return;
}

Assistant:

void addHandle(ze_sampler_handle_t handle) {
    samplerHandleStateMap.insert({handle, nullptr});
  }